

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O3

void __thiscall prevector_tests::prevector_tester<8U,_int>::test(prevector_tester<8U,_int> *this)

{
  pretype *other;
  int *piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  pretype *ppVar8;
  iterator first_00;
  long lVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  DataStream local_78;
  VectorFormatter<DefaultFormatter> local_49;
  direct_or_indirect local_48;
  uint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  other = &this->pre_vector;
  first._M_current =
       (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  last._M_current =
       (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar3 = (this->pre_vector)._size;
  uVar4 = (long)last._M_current - (long)first._M_current >> 2;
  uVar2 = uVar3 - 9;
  if (uVar3 < 9) {
    uVar2 = uVar3;
  }
  bVar7 = (bool)((uVar2 != 0) != ((long)last._M_current - (long)first._M_current == 0) &
                uVar4 == uVar2 & this->passed);
  this->passed = bVar7;
  if (last._M_current != first._M_current) {
    ppVar8 = other;
    if (8 < uVar3) {
      ppVar8 = (pretype *)(other->_union).indirect_contents.indirect;
    }
    piVar11 = (int *)((long)ppVar8 + (uVar4 & 0xffffffff) * -4 + (long)(int)uVar2 * 4);
    uVar13 = 0;
    do {
      piVar1 = (int *)((long)&ppVar8->_union + (long)(int)uVar13 * 4);
      bVar7 = (bool)(piVar11 == piVar1 & uVar13 == (long)(int)uVar13 & bVar7 &
                    first._M_current[uVar13] == *piVar1);
      uVar13 = uVar13 + 1;
      piVar11 = piVar11 + 1;
    } while ((uVar13 & 0xffffffff) < uVar4);
    this->passed = bVar7;
  }
  prevector<8U,_int,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
            ((prevector<8U,_int,_unsigned_int,_int> *)&local_48.indirect_contents,first,last);
  bVar7 = prevector<8U,_int,_unsigned_int,_int>::operator==
                    ((prevector<8U,_int,_unsigned_int,_int> *)&local_48.indirect_contents,other);
  this->passed = (bool)(this->passed & bVar7);
  if (8 < local_28) {
    free(local_48.indirect_contents.indirect);
  }
  uVar3 = (this->pre_vector)._size;
  first_00.ptr = (int *)other;
  if (8 < uVar3) {
    first_00.ptr = (int *)(this->pre_vector)._union.indirect_contents.indirect;
    uVar3 = uVar3 - 9;
  }
  prevector<8U,_int,_unsigned_int,_int>::prevector<prevector<8U,_int,_unsigned_int,_int>::iterator>
            ((prevector<8U,_int,_unsigned_int,_int> *)&local_48.indirect_contents,first_00,
             (iterator)(first_00.ptr + (int)uVar3));
  bVar7 = prevector<8U,_int,_unsigned_int,_int>::operator==
                    ((prevector<8U,_int,_unsigned_int,_int> *)&local_48.indirect_contents,other);
  this->passed = (bool)(this->passed & bVar7);
  if (8 < local_28) {
    free(local_48.indirect_contents.indirect);
  }
  uVar3 = (this->pre_vector)._size;
  ppVar8 = other;
  if (8 < uVar3) {
    ppVar8 = (pretype *)(this->pre_vector)._union.indirect_contents.indirect;
    uVar3 = uVar3 - 9;
  }
  if (uVar3 != 0) {
    lVar9 = (long)(int)uVar3;
    bVar7 = this->passed != false;
    lVar10 = lVar9 * 4;
    lVar5 = 0;
    do {
      bVar7 = (bool)(bVar7 & *(int *)((long)&ppVar8->_union + lVar5) ==
                             *(int *)((long)(this->real_vector).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + 4;
    } while (lVar10 - lVar5 != 0);
    this->passed = bVar7;
    if (uVar3 != 0) {
      bVar7 = this->passed != false;
      do {
        bVar7 = (bool)(bVar7 & *(int *)((long)ppVar8 + lVar10 + -4) ==
                               *(int *)((long)(this->real_vector).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + lVar5 + -4));
        lVar5 = lVar5 + -4;
        lVar10 = lVar10 + -4;
      } while (lVar10 != 0);
      this->passed = bVar7;
      if (uVar3 != 0) {
        bVar7 = this->passed != false;
        lVar10 = 0;
        do {
          lVar12 = lVar10;
          bVar7 = (bool)(bVar7 & *(int *)((long)&ppVar8->_union + lVar12) ==
                                 *(int *)((long)(this->real_vector).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start +
                                         lVar5 + lVar12));
          lVar10 = lVar12 + 4;
        } while (lVar9 * 4 - (lVar12 + 4) != 0);
        this->passed = bVar7;
        if (uVar3 != 0) {
          bVar7 = this->passed != false;
          lVar10 = 0;
          do {
            bVar7 = (bool)(bVar7 & *(int *)((long)ppVar8 + lVar10 + lVar9 * 4 + -4) ==
                                   *(int *)((long)(this->real_vector).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                           lVar5 + lVar10 + lVar12));
            lVar10 = lVar10 + -4;
          } while (-lVar10 != lVar9 * 4);
          this->passed = bVar7;
        }
      }
    }
  }
  local_48._16_8_ = 0;
  local_48._24_8_ = 0;
  local_48.indirect_contents.indirect = (char *)0x0;
  local_48._8_8_ = (char *)0x0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_read_pos = 0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  VectorFormatter<DefaultFormatter>::Ser<DataStream,std::vector<int,std::allocator<int>>>
            (&local_49,(DataStream *)&local_48.indirect_contents,&this->real_vector);
  VectorFormatter<DefaultFormatter>::Ser<DataStream,prevector<8u,int,unsigned_int,int>>
            (&local_49,&local_78,other);
  pcVar6 = local_48.indirect_contents.indirect + local_48._24_8_;
  bVar7 = (bool)(local_48._8_8_ - (long)pcVar6 ==
                 (long)local_78.vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(local_78.vch.
                        super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
                        .super__Vector_impl_data._M_start + local_78.m_read_pos) & this->passed);
  this->passed = bVar7;
  if ((char *)local_48._8_8_ != pcVar6) {
    uVar4 = 0;
    do {
      bVar7 = (bool)(bVar7 & pcVar6[uVar4] ==
                             (local_78.vch.
                              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos)[uVar4]
                    );
      this->passed = bVar7;
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < (ulong)(local_48._8_8_ - (long)pcVar6));
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_78);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
             &local_48.indirect_contents);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void test() {
        const pretype& const_pre_vector = pre_vector;
        local_check_equal(real_vector.size(), pre_vector.size());
        local_check_equal(real_vector.empty(), pre_vector.empty());
        for (Size s = 0; s < real_vector.size(); s++) {
             local_check(real_vector[s] == pre_vector[s]);
             local_check(&(pre_vector[s]) == &(pre_vector.begin()[s]));
             local_check(&(pre_vector[s]) == &*(pre_vector.begin() + s));
             local_check(&(pre_vector[s]) == &*((pre_vector.end() + s) - real_vector.size()));
        }
        // local_check(realtype(pre_vector) == real_vector);
        local_check(pretype(real_vector.begin(), real_vector.end()) == pre_vector);
        local_check(pretype(pre_vector.begin(), pre_vector.end()) == pre_vector);
        size_t pos = 0;
        for (const T& v : pre_vector) {
             local_check(v == real_vector[pos++]);
        }
        for (const T& v : pre_vector | std::views::reverse) {
            local_check(v == real_vector[--pos]);
        }
        for (const T& v : const_pre_vector) {
             local_check(v == real_vector[pos++]);
        }
        for (const T& v : const_pre_vector | std::views::reverse) {
            local_check(v == real_vector[--pos]);
        }
        DataStream ss1{};
        DataStream ss2{};
        ss1 << real_vector;
        ss2 << pre_vector;
        local_check_equal(ss1.size(), ss2.size());
        for (Size s = 0; s < ss1.size(); s++) {
            local_check_equal(ss1[s], ss2[s]);
        }
    }